

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaPValAttrQName
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlSchemaBasicItemPtr ownerItem,
              xmlNodePtr ownerElem,char *name,xmlChar **uri,xmlChar **local)

{
  xmlAttrPtr attr_00;
  xmlAttrPtr attr;
  xmlChar **uri_local;
  char *name_local;
  xmlNodePtr ownerElem_local;
  xmlSchemaBasicItemPtr ownerItem_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  attr_00 = xmlSchemaGetPropNode(ownerElem,name);
  if (attr_00 == (xmlAttrPtr)0x0) {
    *local = (xmlChar *)0x0;
    *uri = (xmlChar *)0x0;
    ctxt_local._4_4_ = 0;
  }
  else {
    ctxt_local._4_4_ = xmlSchemaPValAttrNodeQName(ctxt,schema,ownerItem,attr_00,uri,local);
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaPValAttrQName(xmlSchemaParserCtxtPtr ctxt,
				   xmlSchemaPtr schema,
				   xmlSchemaBasicItemPtr ownerItem,
				   xmlNodePtr ownerElem,
				   const char *name,
				   const xmlChar **uri,
				   const xmlChar **local)
{
    xmlAttrPtr attr;

    attr = xmlSchemaGetPropNode(ownerElem, name);
    if (attr == NULL) {
	*local = NULL;
	*uri = NULL;
	return (0);
    }
    return (xmlSchemaPValAttrNodeQName(ctxt, schema,
	ownerItem, attr, uri, local));
}